

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_waitfds(Curl_multi *multi,curl_waitfd *ufds,uint size,uint *fd_count)

{
  CURLcode CVar1;
  Curl_easy *data_00;
  Curl_easy *data;
  Curl_llist_node *e;
  undefined1 local_40 [4];
  CURLMcode result;
  curl_waitfds cwfds;
  uint *fd_count_local;
  uint size_local;
  curl_waitfd *ufds_local;
  Curl_multi *multi_local;
  
  e._4_4_ = CURLM_OK;
  if (ufds == (curl_waitfd *)0x0) {
    multi_local._4_4_ = CURLM_BAD_FUNCTION_ARGUMENT;
  }
  else if ((multi == (Curl_multi *)0x0) || (multi->magic != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if (((byte)multi->field_0x279 >> 2 & 1) == 0) {
    cwfds._8_8_ = fd_count;
    Curl_waitfds_init((curl_waitfds *)local_40,ufds,size);
    for (data = (Curl_easy *)Curl_llist_head(&multi->process); data != (Curl_easy *)0x0;
        data = (Curl_easy *)Curl_node_next((Curl_llist_node *)data)) {
      data_00 = (Curl_easy *)Curl_node_elem((Curl_llist_node *)data);
      multi_getsock(data_00,&data_00->last_poll);
      CVar1 = Curl_waitfds_add_ps((curl_waitfds *)local_40,&data_00->last_poll);
      if (CVar1 != CURLE_OK) {
        e._4_4_ = CURLM_OUT_OF_MEMORY;
        goto LAB_00168ef3;
      }
    }
    CVar1 = Curl_cpool_add_waitfds(&multi->cpool,(curl_waitfds *)local_40);
    if (CVar1 != CURLE_OK) {
      e._4_4_ = CURLM_OUT_OF_MEMORY;
    }
LAB_00168ef3:
    if (cwfds._8_8_ != 0) {
      *(undefined4 *)cwfds._8_8_ = cwfds.wfds._0_4_;
    }
    multi_local._4_4_ = e._4_4_;
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_waitfds(struct Curl_multi *multi,
                             struct curl_waitfd *ufds,
                             unsigned int size,
                             unsigned int *fd_count)
{
  struct curl_waitfds cwfds;
  CURLMcode result = CURLM_OK;
  struct Curl_llist_node *e;

  if(!ufds)
    return CURLM_BAD_FUNCTION_ARGUMENT;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  Curl_waitfds_init(&cwfds, ufds, size);
  for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
    struct Curl_easy *data = Curl_node_elem(e);
    multi_getsock(data, &data->last_poll);
    if(Curl_waitfds_add_ps(&cwfds, &data->last_poll)) {
      result = CURLM_OUT_OF_MEMORY;
      goto out;
    }
  }

  if(Curl_cpool_add_waitfds(&multi->cpool, &cwfds)) {
    result = CURLM_OUT_OF_MEMORY;
    goto out;
  }

out:
  if(fd_count)
    *fd_count = cwfds.n;
  return result;
}